

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O1

void writeErrors(string *description,vector<CError,_std::allocator<CError>_> *errors)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pCVar2;
  pointer pcVar3;
  ostream *poVar4;
  string *psVar5;
  pointer pCVar6;
  CError error;
  string local_90;
  PositionInfo local_70;
  CError local_60;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(description->_M_dataplus)._M_p,
                      description->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  pCVar6 = (errors->super__Vector_base<CError,_std::allocator<CError>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (errors->super__Vector_base<CError,_std::allocator<CError>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar6 != pCVar2) {
    paVar1 = &local_60.message.field_2;
    do {
      pcVar3 = (pCVar6->message)._M_dataplus._M_p;
      local_60.message._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar3,pcVar3 + (pCVar6->message)._M_string_length);
      local_60.position.firstLine = (pCVar6->position).firstLine;
      local_60.position.lastLine = (pCVar6->position).lastLine;
      local_60.position.firstColumn = (pCVar6->position).firstColumn;
      local_60.position.lastColumn = (pCVar6->position).lastColumn;
      local_70 = CError::GetPosition(&local_60);
      PositionInfo::GetStringPosition_abi_cxx11_(&local_90,&local_70);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_90._M_dataplus._M_p,local_90._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      psVar5 = CError::GetMessage_abi_cxx11_(&local_60);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.message._M_dataplus._M_p != paVar1) {
        operator_delete(local_60.message._M_dataplus._M_p);
      }
      pCVar6 = pCVar6 + 1;
    } while (pCVar6 != pCVar2);
  }
  return;
}

Assistant:

void writeErrors( const std::string &description, const std::vector<CError> &errors ) {
    std::cout << description << "\n";

    for ( auto error : errors ) {
        std::cout << error.GetPosition( ).GetStringPosition( ) << " " << error.GetMessage( ) << "\n";
    }
}